

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_window_show(nk_context *ctx,char *name,nk_show_states s)

{
  int iVar1;
  nk_window *pnVar2;
  int in_EDX;
  char *in_RSI;
  nk_context *in_RDI;
  nk_window *win;
  nk_hash title_hash;
  int title_len;
  nk_hash hash;
  
  if (in_RDI != (nk_context *)0x0) {
    iVar1 = nk_strlen(in_RSI);
    hash = (nk_hash)((ulong)in_RSI >> 0x20);
    nk_murmur_hash(name,s,title_len);
    pnVar2 = nk_find_window(in_RDI,hash,(char *)CONCAT44(in_EDX,iVar1));
    if (pnVar2 != (nk_window *)0x0) {
      if (in_EDX == 0) {
        pnVar2->flags = pnVar2->flags | 0x1000;
      }
      else {
        pnVar2->flags = pnVar2->flags & 0xffffefff;
      }
    }
  }
  return;
}

Assistant:

NK_API void
nk_window_show(struct nk_context *ctx, const char *name, enum nk_show_states s)
{
    int title_len;
    nk_hash title_hash;
    struct nk_window *win;
    NK_ASSERT(ctx);
    if (!ctx) return;

    title_len = (int)nk_strlen(name);
    title_hash = nk_murmur_hash(name, (int)title_len, NK_WINDOW_TITLE);
    win = nk_find_window(ctx, title_hash, name);
    if (!win) return;
    if (s == NK_HIDDEN)
        win->flags |= NK_WINDOW_HIDDEN;
    else win->flags &= ~(nk_flags)NK_WINDOW_HIDDEN;
}